

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

void __thiscall cmCTestCVS::UpdateParser::~UpdateParser(UpdateParser *this)

{
  UpdateParser *this_local;
  
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__UpdateParser_01675668;
  cmsys::RegularExpression::~RegularExpression(&this->RegexFileRemoved2);
  cmsys::RegularExpression::~RegularExpression(&this->RegexFileRemoved1);
  cmsys::RegularExpression::~RegularExpression(&this->RegexFileConflicting);
  cmsys::RegularExpression::~RegularExpression(&this->RegexFileModified);
  cmsys::RegularExpression::~RegularExpression(&this->RegexFileUpdated);
  cmProcessTools::LineParser::~LineParser(&this->super_LineParser);
  return;
}

Assistant:

UpdateParser(cmCTestCVS* cvs, const char* prefix)
    : CVS(cvs)
  {
    this->SetLog(&cvs->Log, prefix);
    // See "man cvs", section "update output".
    this->RegexFileUpdated.compile("^([UP])  *(.*)");
    this->RegexFileModified.compile("^([MRA])  *(.*)");
    this->RegexFileConflicting.compile("^([C])  *(.*)");
    this->RegexFileRemoved1.compile(
      "cvs[^ ]* update: `?([^']*)'? is no longer in the repository");
    this->RegexFileRemoved2.compile(
      "cvs[^ ]* update: "
      "warning: `?([^']*)'? is not \\(any longer\\) pertinent");
  }